

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_restore(DisasContext_conflict6 *ctx,uint8_t rt,uint8_t count,uint8_t gp,uint16_t u)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 arg;
  TCGv_i64 arg_00;
  uint local_4c;
  int this_offset;
  int this_rt;
  _Bool use_gp;
  TCGv_i64 t0;
  TCGv_i64 va;
  int counter;
  TCGContext_conflict6 *tcg_ctx;
  uint16_t u_local;
  uint8_t gp_local;
  uint8_t count_local;
  uint8_t rt_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  va._4_4_ = 0;
  arg = tcg_temp_new_i64(tcg_ctx_00);
  arg_00 = tcg_temp_new_i64(tcg_ctx_00);
  for (; va._4_4_ != count; va._4_4_ = va._4_4_ + 1) {
    if (gp == '\0' || va._4_4_ != count - 1) {
      local_4c = rt & 0x10 | rt + va._4_4_ & 0x1f;
    }
    else {
      local_4c = 0x1c;
    }
    gen_base_offset_addr(ctx,arg,0x1d,(uint)u + (va._4_4_ + 1) * -4);
    tcg_gen_qemu_ld_i64_mips64el
              (tcg_ctx_00,arg_00,arg,(long)ctx->mem_idx,ctx->default_tcg_memop_mask | MO_LESL);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,arg_00,arg_00);
    gen_store_gpr(tcg_ctx_00,arg_00,local_4c);
  }
  gen_adjust_sp(ctx,(uint)u);
  tcg_temp_free_i64(tcg_ctx_00,arg_00);
  tcg_temp_free_i64(tcg_ctx_00,arg);
  return;
}

Assistant:

static void gen_restore(DisasContext *ctx, uint8_t rt, uint8_t count,
                        uint8_t gp, uint16_t u)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int counter = 0;
    TCGv va = tcg_temp_new(tcg_ctx);
    TCGv t0 = tcg_temp_new(tcg_ctx);

    while (counter != count) {
        bool use_gp = gp && (counter == count - 1);
        int this_rt = use_gp ? 28 : (rt & 0x10) | ((rt + counter) & 0x1f);
        int this_offset = u - ((counter + 1) << 2);
        gen_base_offset_addr(ctx, va, 29, this_offset);
        tcg_gen_qemu_ld_tl(tcg_ctx, t0, va, ctx->mem_idx, MO_TESL |
                        ctx->default_tcg_memop_mask);
        tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
        gen_store_gpr(tcg_ctx, t0, this_rt);
        counter++;
    }

    /* adjust stack pointer */
    gen_adjust_sp(ctx, u);

    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, va);
}